

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

void Cloud_bddPrint(CloudManager *dd,CloudNode *Func)

{
  CloudNode *bCube;
  bool bVar1;
  char *__format;
  
  if (dd->zero == Func) {
    __format = "Constant 0.";
  }
  else {
    if (dd->one != Func) {
      bVar1 = false;
      while( true ) {
        bCube = Cloud_GetOneCube(dd,Func);
        if ((bCube == (CloudNode *)0x0) || (bCube == dd->zero)) break;
        if (bVar1) {
          printf(" + ");
        }
        Cloud_bddPrintCube(dd,bCube);
        Func = Cloud_bddAnd(dd,Func,(CloudNode *)((ulong)bCube ^ 1));
        bVar1 = true;
      }
      goto LAB_004c2fe3;
    }
    __format = "Constant 1.";
  }
  printf(__format);
LAB_004c2fe3:
  putchar(10);
  return;
}

Assistant:

void Cloud_bddPrint( CloudManager * dd, CloudNode * Func )
{
    CloudNode * Cube;
    int fFirst = 1;

    if ( Func == dd->zero )
        printf( "Constant 0." );
    else if ( Func == dd->one )
        printf( "Constant 1." );
    else
    {
        while ( 1 )
        {
            Cube = Cloud_GetOneCube( dd, Func );
            if ( Cube == NULL || Cube == dd->zero )
                break;
            if ( fFirst )       fFirst = 0;
            else                printf( " + " );
            Cloud_bddPrintCube( dd, Cube );
            Func = Cloud_bddAnd( dd, Func, Cloud_Not(Cube) );
        } 
    }
    printf( "\n" );
}